

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QFontEngineFT::GlyphAndSubPixelPosition,QFontEngine::Glyph*>::
emplace_helper<QFontEngine::Glyph*const&>
          (QHash<QFontEngineFT::GlyphAndSubPixelPosition,QFontEngine::Glyph*> *this,
          GlyphAndSubPixelPosition *key,Glyph **args)

{
  byte bVar1;
  Entry *pEVar2;
  piter pVar3;
  Glyph *pGVar4;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::
  Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>::
  findOrInsert<QFontEngineFT::GlyphAndSubPixelPosition>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
               **)this,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(int *)(pEVar2[bVar1].storage.data + 8) = (key->subPixelPosition).y.val;
    *(undefined8 *)pEVar2[bVar1].storage.data = *(undefined8 *)key;
    pGVar4 = *args;
  }
  else {
    pGVar4 = *args;
  }
  *(Glyph **)(pEVar2[bVar1].storage.data + 0x10) = pGVar4;
  pVar3.bucket = local_38._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<QFontEngineFT::GlyphAndSubPixelPosition,_QFontEngine::Glyph_*>_>
             *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }